

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  BPMNode **ppBVar1;
  BPMNode **ppBVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  BPMNode *pBVar10;
  uint uVar11;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar19 [32];
  ulong uVar12;
  undefined1 auVar18 [32];
  
  uVar11 = lists->nextfree;
  if (lists->numfree <= uVar11) {
    uVar9 = (ulong)lists->memsize;
    if (uVar9 != 0) {
      pBVar10 = lists->memory;
      lVar13 = uVar9 - 1;
      auVar17._8_8_ = lVar13;
      auVar17._0_8_ = lVar13;
      auVar18._16_8_ = lVar13;
      auVar18._0_16_ = auVar17;
      auVar18._24_8_ = lVar13;
      auVar7 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      lVar13 = 0;
      auVar15._8_8_ = 0x8000000000000000;
      auVar15._0_8_ = 0x8000000000000000;
      auVar3 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
      auVar16._8_8_ = 0x8000000000000000;
      auVar16._0_8_ = 0x8000000000000000;
      auVar16._16_8_ = 0x8000000000000000;
      auVar16._24_8_ = 0x8000000000000000;
      auVar19._8_8_ = 8;
      auVar19._0_8_ = 8;
      auVar19._16_8_ = 8;
      auVar19._24_8_ = 8;
      do {
        auVar4 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar15,auVar17 ^ auVar15);
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
        if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10->in_use + lVar13) = 0;
        }
        auVar4 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar15,auVar17 ^ auVar15);
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
        if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10[1].in_use + lVar13) = 0;
        }
        auVar6 = vpcmpgtq_avx2(auVar8 ^ auVar16,auVar18 ^ auVar16);
        auVar5 = vpackssdw_avx2(auVar6,auVar7);
        auVar4 = auVar5._16_16_ ^ auVar3;
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10[2].in_use + lVar13) = 0;
        }
        auVar5 = vpackssdw_avx2(auVar6,auVar7);
        auVar4 = auVar5._16_16_ ^ auVar3;
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10[3].in_use + lVar13) = 0;
        }
        auVar4 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar15,auVar17 ^ auVar15);
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
        if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10[4].in_use + lVar13) = 0;
        }
        auVar4 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar15,auVar17 ^ auVar15);
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        auVar4 = vpackssdw_avx(auVar4 ^ auVar3,auVar4 ^ auVar3);
        if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10[5].in_use + lVar13) = 0;
        }
        auVar6 = vpcmpgtq_avx2(auVar7 ^ auVar16,auVar18 ^ auVar16);
        auVar5 = vpackssdw_avx2(auVar7,auVar6);
        auVar4 = auVar5._16_16_ ^ auVar3;
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10[6].in_use + lVar13) = 0;
        }
        auVar5 = vpshufhw_avx2(auVar6,0x84);
        auVar4 = auVar5._16_16_ ^ auVar3;
        auVar4 = vpackssdw_avx(auVar4,auVar4);
        if ((auVar4 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar10[7].in_use + lVar13) = 0;
        }
        auVar8 = vpaddq_avx2(auVar19,auVar8);
        auVar7 = vpaddq_avx2(auVar19,auVar7);
        lVar13 = lVar13 + 0xc0;
      } while ((uVar9 * 8 + 0x38 & 0xffffffffffffffc0) * 3 != lVar13);
    }
    uVar11 = lists->listsize;
    if ((ulong)uVar11 != 0) {
      ppBVar1 = lists->chains0;
      ppBVar2 = lists->chains1;
      uVar14 = 0;
      do {
        for (pBVar10 = ppBVar1[uVar14]; pBVar10 != (BPMNode *)0x0; pBVar10 = pBVar10->tail) {
          pBVar10->in_use = 1;
        }
        for (pBVar10 = ppBVar2[uVar14]; pBVar10 != (BPMNode *)0x0; pBVar10 = pBVar10->tail) {
          pBVar10->in_use = 1;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar11);
    }
    lists->numfree = 0;
    if (uVar9 != 0) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        uVar12 = uVar14;
        if (*(int *)((long)&lists->memory->in_use + lVar13) == 0) {
          uVar11 = (int)uVar14 + 1;
          uVar12 = (ulong)uVar11;
          lists->numfree = uVar11;
          lists->freelist[uVar14] = (BPMNode *)((long)&lists->memory->weight + lVar13);
        }
        lVar13 = lVar13 + 0x18;
        uVar14 = uVar12;
      } while (uVar9 * 0x18 != lVar13);
    }
    uVar11 = 0;
  }
  lists->nextfree = uVar11 + 1;
  pBVar10 = lists->freelist[uVar11];
  pBVar10->weight = weight;
  pBVar10->index = index;
  pBVar10->tail = tail;
  return pBVar10;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree)
  {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i)
    {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i)
    {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}